

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O3

void duckdb_je_emap_register_interior(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong key;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)edata->e_addr & 0xfffffffffffff000;
  uVar9 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) + uVar10) - 0x2000;
  uVar10 = uVar10 + 0x1000;
  if (uVar10 <= uVar9) {
    prVar7 = (rtree_leaf_elm_t *)0x0;
    key = uVar10;
    do {
      if (key == uVar10 || (key & 0x3fffffff) == 0) {
        uVar6 = key & 0xffffffffc0000000;
        uVar8 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
        puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar8);
        uVar8 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar8);
        if (uVar8 == uVar6) {
          prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar1[1]);
        }
        else if (ctx->l2_cache[0].leafkey == uVar6) {
          prVar7 = ctx->l2_cache[0].leaf;
          ctx->l2_cache[0].leafkey = uVar8;
          ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
          *puVar1 = uVar6;
          puVar1[1] = (ulong)prVar7;
          prVar7 = (rtree_leaf_elm_t *)
                   ((long)&(prVar7->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
        }
        else {
          lVar11 = 0x118;
          do {
            if (*(ulong *)((long)ctx->cache + lVar11 + -8) == uVar6) {
              uVar4 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar11);
              puVar2 = (undefined8 *)((long)ctx->cache + lVar11 + -0x18);
              uVar5 = puVar2[1];
              puVar3 = (undefined8 *)((long)ctx->cache + lVar11 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar5;
              *(ulong *)((long)ctx->cache + lVar11 + -0x18) = uVar8;
              *(ulong *)((long)(ctx->cache + -1) + lVar11) = puVar1[1];
              *puVar1 = uVar6;
              puVar1[1] = uVar4;
              prVar7 = (rtree_leaf_elm_t *)(((uint)(key >> 9) & 0x1ffff8) + uVar4);
              goto LAB_011733ea;
            }
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x188);
          prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key,true,false);
        }
      }
LAB_011733ea:
      (prVar7->le_bits).repr =
           (void *)(((ulong)edata & 0xfffffffffffe) + ((ulong)szind << 0x30) + 1);
      prVar7 = prVar7 + 1;
      key = key + 0x1000;
    } while (key <= uVar9);
  }
  return;
}

Assistant:

void
emap_register_interior(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    szind_t szind) {
	EMAP_DECLARE_RTREE_CTX;

	assert(edata_slab_get(edata));
	assert(edata_state_get(edata) == extent_state_active);

	if (config_debug) {
		/* Making sure the boundary is registered already. */
		rtree_leaf_elm_t *elm_a, *elm_b;
		bool err = emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx,
		    edata, /* dependent */ true, /* init_missing */ false,
		    &elm_a, &elm_b);
		assert(!err);
		rtree_contents_t contents_a, contents_b;
		contents_a = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_a,
		    /* dependent */ true);
		contents_b = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_b,
		    /* dependent */ true);
		assert(contents_a.edata == edata && contents_b.edata == edata);
		assert(contents_a.metadata.slab && contents_b.metadata.slab);
	}

	rtree_contents_t contents;
	contents.edata = edata;
	contents.metadata.szind = szind;
	contents.metadata.slab = true;
	contents.metadata.state = extent_state_active;
	contents.metadata.is_head = false; /* Not allowed to access. */

	assert(edata_size_get(edata) > (2 << LG_PAGE));
	rtree_write_range(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata) + PAGE,
	    (uintptr_t)edata_last_get(edata) - PAGE, contents);
}